

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void ExtensionObject_deleteMembers(UA_ExtensionObject *p,UA_DataType *_)

{
  void *p_00;
  
  if (p->encoding < UA_EXTENSIONOBJECT_DECODED) {
    NodeId_deleteMembers(&(p->content).encoded.typeId,_);
    String_deleteMembers(&(p->content).encoded.body,_);
    return;
  }
  if ((p->encoding == UA_EXTENSIONOBJECT_DECODED) &&
     (p_00 = (p->content).decoded.data, p_00 != (void *)0x0)) {
    UA_delete(p_00,(p->content).decoded.type);
    return;
  }
  return;
}

Assistant:

static void
ExtensionObject_deleteMembers(UA_ExtensionObject *p, const UA_DataType *_) {
    switch(p->encoding) {
    case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
    case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
    case UA_EXTENSIONOBJECT_ENCODED_XML:
        NodeId_deleteMembers(&p->content.encoded.typeId, NULL);
        String_deleteMembers(&p->content.encoded.body, NULL);
        break;
    case UA_EXTENSIONOBJECT_DECODED:
        if(p->content.decoded.data)
            UA_delete(p->content.decoded.data, p->content.decoded.type);
        break;
    default:
        break;
    }
}